

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdinput.c
# Opt level: O3

int consume_markers(j_decompress_ptr cinfo)

{
  jpeg_input_controller *pjVar1;
  jpeg_error_mgr *pjVar2;
  jpeg_decomp_master *pjVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  int *piVar13;
  
  pjVar1 = cinfo->inputctl;
  iVar8 = 2;
  if (pjVar1->eoi_reached == 0) {
    iVar4 = (*cinfo->marker->read_markers)(cinfo);
    if (iVar4 == 2) {
      pjVar1->eoi_reached = 1;
      if (*(int *)&pjVar1[1].consume_input == 0) {
        if (cinfo->input_scan_number < cinfo->output_scan_number) {
          cinfo->output_scan_number = cinfo->input_scan_number;
        }
      }
      else if (cinfo->marker->saw_SOF != 0) {
        pjVar2 = cinfo->err;
        pjVar2->msg_code = 0x3b;
        (*pjVar2->error_exit)((j_common_ptr)cinfo);
      }
    }
    else {
      iVar8 = iVar4;
      if (iVar4 == 1) {
        if (*(int *)&pjVar1[1].consume_input == 0) {
          if (pjVar1->has_multiple_scans == 0) {
            pjVar2 = cinfo->err;
            pjVar2->msg_code = 0x23;
            (*pjVar2->error_exit)((j_common_ptr)cinfo);
          }
          start_input_pass(cinfo);
          iVar8 = 1;
        }
        else {
          if ((0xffdc < cinfo->image_height) || (0xffdc < cinfo->image_width)) {
            *(undefined8 *)&cinfo->err->msg_code = 0xffdc00000029;
            (*cinfo->err->error_exit)((j_common_ptr)cinfo);
          }
          iVar8 = cinfo->data_precision;
          if (iVar8 != 8) {
            pjVar2 = cinfo->err;
            pjVar2->msg_code = 0xf;
            (pjVar2->msg_parm).i[0] = iVar8;
            (*cinfo->err->error_exit)((j_common_ptr)cinfo);
          }
          iVar8 = cinfo->num_components;
          if (10 < iVar8) {
            pjVar2 = cinfo->err;
            pjVar2->msg_code = 0x1a;
            (pjVar2->msg_parm).i[0] = iVar8;
            (cinfo->err->msg_parm).i[1] = 10;
            (*cinfo->err->error_exit)((j_common_ptr)cinfo);
            iVar8 = cinfo->num_components;
          }
          cinfo->max_h_samp_factor = 1;
          cinfo->max_v_samp_factor = 1;
          if (iVar8 < 1) {
            cinfo->min_DCT_scaled_size = 8;
            iVar4 = 1;
          }
          else {
            piVar13 = &cinfo->comp_info->v_samp_factor;
            iVar9 = 0;
            iVar4 = 1;
            iVar10 = 1;
            do {
              iVar7 = piVar13[-1];
              if ((iVar7 - 5U < 0xfffffffc) || (iVar11 = *piVar13, iVar11 - 5U < 0xfffffffc)) {
                pjVar2 = cinfo->err;
                pjVar2->msg_code = 0x12;
                (*pjVar2->error_exit)((j_common_ptr)cinfo);
                iVar8 = cinfo->num_components;
                iVar10 = cinfo->max_h_samp_factor;
                iVar7 = piVar13[-1];
                iVar11 = *piVar13;
                iVar4 = cinfo->max_v_samp_factor;
              }
              if (iVar7 < iVar10) {
                iVar7 = iVar10;
              }
              iVar10 = iVar7;
              cinfo->max_h_samp_factor = iVar10;
              if (iVar11 < iVar4) {
                iVar11 = iVar4;
              }
              iVar4 = iVar11;
              cinfo->max_v_samp_factor = iVar4;
              iVar9 = iVar9 + 1;
              piVar13 = piVar13 + 0x18;
            } while (iVar9 < iVar8);
            cinfo->min_DCT_scaled_size = 8;
            if (0 < iVar8) {
              piVar13 = &cinfo->comp_info->h_samp_factor;
              lVar12 = 0;
              do {
                piVar13[7] = 8;
                lVar6 = jdiv_round_up((long)*piVar13 * (ulong)cinfo->image_width,
                                      (long)cinfo->max_h_samp_factor << 3);
                piVar13[5] = (JDIMENSION)lVar6;
                lVar6 = jdiv_round_up((long)piVar13[1] * (ulong)cinfo->image_height,
                                      (long)cinfo->max_v_samp_factor << 3);
                piVar13[6] = (JDIMENSION)lVar6;
                pjVar3 = cinfo->master;
                pjVar3->first_MCU_col[lVar12] = 0;
                pjVar3->last_MCU_col[lVar12] = piVar13[5] - 1;
                lVar6 = jdiv_round_up((long)*piVar13 * (ulong)cinfo->image_width,
                                      (long)cinfo->max_h_samp_factor);
                piVar13[8] = (JDIMENSION)lVar6;
                lVar6 = jdiv_round_up((long)piVar13[1] * (ulong)cinfo->image_height,
                                      (long)cinfo->max_v_samp_factor);
                piVar13[9] = (JDIMENSION)lVar6;
                piVar13[10] = 1;
                *(JQUANT_TBL **)(piVar13 + 0x12) = (JQUANT_TBL *)0x0;
                lVar12 = lVar12 + 1;
                piVar13 = piVar13 + 0x18;
              } while (lVar12 < cinfo->num_components);
              iVar4 = cinfo->max_v_samp_factor;
            }
          }
          lVar12 = jdiv_round_up((ulong)cinfo->image_height,(long)(iVar4 << 3));
          cinfo->total_iMCU_rows = (JDIMENSION)lVar12;
          iVar8 = 1;
          uVar5 = 1;
          if (cinfo->num_components <= cinfo->comps_in_scan) {
            uVar5 = (uint)(cinfo->progressive_mode != 0);
          }
          cinfo->inputctl->has_multiple_scans = uVar5;
          *(undefined4 *)&pjVar1[1].consume_input = 0;
        }
      }
    }
  }
  return iVar8;
}

Assistant:

METHODDEF(int)
consume_markers(j_decompress_ptr cinfo)
{
  my_inputctl_ptr inputctl = (my_inputctl_ptr)cinfo->inputctl;
  int val;

  if (inputctl->pub.eoi_reached) /* After hitting EOI, read no further */
    return JPEG_REACHED_EOI;

  val = (*cinfo->marker->read_markers) (cinfo);

  switch (val) {
  case JPEG_REACHED_SOS:        /* Found SOS */
    if (inputctl->inheaders) {  /* 1st SOS */
      initial_setup(cinfo);
      inputctl->inheaders = FALSE;
      /* Note: start_input_pass must be called by jdmaster.c
       * before any more input can be consumed.  jdapimin.c is
       * responsible for enforcing this sequencing.
       */
    } else {                    /* 2nd or later SOS marker */
      if (!inputctl->pub.has_multiple_scans)
        ERREXIT(cinfo, JERR_EOI_EXPECTED); /* Oops, I wasn't expecting this! */
      start_input_pass(cinfo);
    }
    break;
  case JPEG_REACHED_EOI:        /* Found EOI */
    inputctl->pub.eoi_reached = TRUE;
    if (inputctl->inheaders) {  /* Tables-only datastream, apparently */
      if (cinfo->marker->saw_SOF)
        ERREXIT(cinfo, JERR_SOF_NO_SOS);
    } else {
      /* Prevent infinite loop in coef ctlr's decompress_data routine
       * if user set output_scan_number larger than number of scans.
       */
      if (cinfo->output_scan_number > cinfo->input_scan_number)
        cinfo->output_scan_number = cinfo->input_scan_number;
    }
    break;
  case JPEG_SUSPENDED:
    break;
  }

  return val;
}